

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *pEVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  EVP_MD_CTX *local_60;
  LIBSSH2_SESSION *local_58;
  EVP_PKEY *local_50;
  uchar local_48 [24];
  
  pEVar1 = (EVP_PKEY *)*abstract;
  iVar2 = _libssh2_sha1_init(&local_60);
  if (iVar2 == 0) {
    *signature = (uchar *)0x0;
    *signature_len = 0;
    iVar2 = -1;
  }
  else {
    local_50 = pEVar1;
    puVar4 = (uchar *)_libssh2_calloc(session,0x28);
    *signature = puVar4;
    iVar2 = -1;
    if (puVar4 != (uchar *)0x0) {
      *signature_len = 0x28;
      local_58 = session;
      if (0 < veccount) {
        lVar5 = 0;
        do {
          iVar3 = _libssh2_sha1_update
                            (&local_60,*(void **)((long)&datavec->iov_base + lVar5),
                             *(size_t *)((long)&datavec->iov_len + lVar5));
          if (iVar3 == 0) {
            return -1;
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uint)veccount << 4 != lVar5);
      }
      iVar3 = _libssh2_sha1_final(&local_60,local_48);
      if (iVar3 != 0) {
        iVar3 = _libssh2_dsa_sha1_sign(local_50,local_48,0x14,*signature);
        if (iVar3 == 0) {
          iVar2 = 0;
        }
        else {
          (*local_58->free)(*signature,&local_58->abstract);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    if(!libssh2_sha1_init(&ctx)) {
        *signature = NULL;
        *signature_len = 0;
        return -1;
    }

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if(!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha1_update(ctx,
                                datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha1_final(ctx, hash)) {
        return -1;
    }

    if(_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}